

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O2

void __thiscall QFunctionJAOHTree::ComputeQ(QFunctionJAOHTree *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  PlanningUnitMADPDiscrete *pPVar4;
  JointBeliefInterface *pJVar5;
  long *plVar6;
  size_type __n;
  BayesianGameIdenticalPayoff *this_00;
  size_t sVar7;
  long lVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions;
  ulong uVar9;
  E *this_01;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BGIP_sharedPtr bg_time_step;
  ulong local_1a0;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_198;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  lVar3 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
  lVar3 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0
                                + lVar3) + 0x60))
                    (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar3);
  if (lVar3 != 0) {
    lVar3 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    pPVar4 = (PlanningUnitMADPDiscrete *)
             (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                     field_0x0 + lVar3) + 0x60))
                       (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar3)
    ;
    pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(pPVar4);
    lVar3 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    lVar3 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                    field_0x0 + lVar3) + 0x60))
                      (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar3);
    lVar3 = *(long *)(lVar3 + 0x18);
    lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    plVar6 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOH).
                                             super_QFunctionJAOHInterface.field_0x0 + lVar8) + 0x60)
                     )(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8);
    __n = (**(code **)(*plVar6 + 0x30))(plVar6);
    bgs.super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>.
    super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
    _vptr_BayesianGameIdenticalPayoffSolver = (_func_int **)0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&nrTypes,__n,(value_type_conflict2 *)&bgs,(allocator_type *)&bg_time_step);
    this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
    lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    plVar6 = (long *)(**(code **)(*(long *)(&(this->super_QFunctionJAOH).
                                             super_QFunctionJAOHInterface.field_0x0 + lVar8) + 0x60)
                     )(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8);
    sVar7 = (**(code **)(*plVar6 + 0x30))(plVar6);
    lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
    lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                    field_0x0 + lVar8) + 0x60))
                      (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8);
    nrActions = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (**(code **)(**(long **)(lVar8 + 0x30) + 0x58))();
    BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(this_00,sVar7,nrActions,&nrTypes,false)
    ;
    boost::shared_ptr<BayesianGameIdenticalPayoff>::shared_ptr<BayesianGameIdenticalPayoff>
              (&bg_time_step,this_00);
    uVar11 = 0;
    BayesianGameBase::SetProbability((BayesianGameBase *)bg_time_step.px,0,1.0);
    while( true ) {
      lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
      lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                      field_0x0 + lVar8) + 0x60))
                        (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8
                        );
      uVar9 = (**(code **)(**(long **)(lVar8 + 0x30) + 0x68))();
      uVar12 = (ulong)uVar11;
      if (uVar9 <= uVar12) break;
      uVar10 = 0;
      local_1a0 = 0;
      while( true ) {
        lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
        pPVar4 = (PlanningUnitMADPDiscrete *)
                 (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                         field_0x0 + lVar8) + 0x60))
                           (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 +
                            lVar8);
        sVar7 = PlanningUnitMADPDiscrete::GetNrStates(pPVar4);
        if (sVar7 <= uVar10) break;
        uVar9 = (**(code **)(*(long *)(&pJVar5->field_0x0 + *(long *)((long)*pJVar5 + -0xb8)) + 0x48
                            ))(&pJVar5->field_0x0 + *(long *)((long)*pJVar5 + -0xb8),(ulong)uVar10);
        lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
        lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                        field_0x0 + lVar8) + 0x60))
                          (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 +
                           lVar8);
        auVar13._0_8_ =
             (**(code **)(**(long **)(lVar8 + 0x330) + 0xc0))
                       (*(long **)(lVar8 + 0x330),uVar10,uVar12);
        auVar13._8_56_ = extraout_var;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_1a0;
        uVar10 = uVar10 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar9;
        auVar2 = vfmadd231sd_fma(auVar15,auVar13._0_16_,auVar1);
        local_1a0 = auVar2._0_8_;
      }
      uVar9 = 0;
      if (lVar3 != 1) {
        uVar9 = (**(code **)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + 0x78))
                          (this,1,0,uVar12);
      }
      lVar8 = *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88);
      lVar8 = (**(code **)(*(long *)(&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.
                                      field_0x0 + lVar8) + 0x60))
                        (&(this->super_QFunctionJAOH).super_QFunctionJAOHInterface.field_0x0 + lVar8
                        );
      plVar6 = *(long **)(lVar8 + 0x330);
      auVar14._0_8_ =
           (**(code **)(*(long *)((long)plVar6 + *(long *)(*plVar6 + -0xb0)) + 0x70))
                     ((long)plVar6 + *(long *)(*plVar6 + -0xb0));
      auVar14._8_56_ = extraout_var_00;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar9;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1a0;
      auVar2 = vfmadd213sd_fma(auVar16,auVar14._0_16_,auVar2);
      (this->super_QFunctionJAOH)._m_QValues.super_matrix_t.data_.data_[uVar12] = auVar2._0_8_;
      (*((bg_time_step.px)->_m_utilFunction->super_QTableInterface)._vptr_QTableInterface[1])
                (auVar2._0_8_,(bg_time_step.px)->_m_utilFunction,0,uVar12);
      uVar11 = uVar11 + 1;
    }
    local_198.px = &(bg_time_step.px)->super_BayesianGameIdenticalPayoffInterface;
    local_198.pn.pi_ = bg_time_step.pn.pi_;
    if (bg_time_step.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (bg_time_step.pn.pi_)->use_count_ = (bg_time_step.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    BGIP_SolverBruteForceSearch<JointPolicyPureVector>::BGIP_SolverBruteForceSearch
              (&bgs,&local_198,0,0x7fffffff,0);
    boost::detail::shared_count::~shared_count(&local_198.pn);
    BGIP_SolverBruteForceSearch<JointPolicyPureVector>::Solve(&bgs);
    if (pJVar5 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*pJVar5 + 8))(pJVar5);
    }
    BayesianGameIdenticalPayoffSolver::~BayesianGameIdenticalPayoffSolver
              ((BayesianGameIdenticalPayoffSolver *)&bgs);
    boost::detail::shared_count::~shared_count(&bg_time_step.pn);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    return;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,"QFunctionJAOHTree::ComputeQ - GetPU() returns 0; no PlanningUnit available!");
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void QFunctionJAOHTree::ComputeQ()
{
    if(GetPU() == 0)
        throw E("QFunctionJAOHTree::ComputeQ - GetPU() returns 0; no PlanningUnit available!");

    size_t time_step = 0;
#if QFunctionJAOH_useIndices
#else    
    JointActionObservationHistoryTree* root = GetPU()->
        GetJointActionObservationHistoryTree(Globals::INITIAL_JAOHI);
#endif
    JointBeliefInterface* b0p = GetPU()->GetNewJointBeliefFromISD(); 
    JointBeliefInterface& b0 =  *b0p;
    
    bool last_t = false;
    if( (time_step + 1) == GetPU()->GetHorizon()) //unlikely, but possible
        last_t = true;

    if(DEBUG_QHEUR_COMP_TREE){cout << "QFunctionJAOHTree::Compute() called" << endl;}

    //in the first time_step t=0, there is no previous action and there is only
    //the empty observation action history.
    //Therefore we're going to construct a Bayesian game where there is only 1
    //type for each agent.
    vector<size_t> nrTypes = vector<size_t>(GetPU()->GetNrAgents(), 1);
    BGIP_sharedPtr bg_time_step=BGIP_sharedPtr(
        new BayesianGameIdenticalPayoff(GetPU()->GetNrAgents(), 
                                        GetPU()->GetNrActions(),
                                        nrTypes));

    size_t empty_jaohI = 0;
    bg_time_step->SetProbability(empty_jaohI, 1.0);
    for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
    {
        //calculate R(joah',newJA) - expected immediate reward for time_step
        double exp_imm_R = 0.0;
#if USE_BeliefIteratorGeneric
        BeliefIteratorGeneric it=b0.GetIterator();
        do exp_imm_R += it.GetProbability() *
            GetPU()->GetReward(it.GetStateIndex(), newJAI);
        while (it.Next());
#else
        for(Index sI=0; sI < GetPU()->GetNrStates(); sI++)
            exp_imm_R += (b0.Get(sI)) * GetPU()->GetReward(sI, newJAI);
#endif        
        //calculate Q(jaoh', newJA) =  R(joah',newJA) + exp. future R
        //  and the exp. future R = ComputeRecursively(t+1, root, newJA)
        double exp_fut_R = 0.0;
        if(!last_t)
#if QFunctionJAOH_useIndices
            exp_fut_R = ComputeRecursively( 1, Globals::INITIAL_JAOHI, newJAI);
#else    
            exp_fut_R = ComputeRecursively( 1, root, newJAI);
#endif
        double Q = exp_imm_R + GetPU()->GetDiscount() * exp_fut_R;
        _m_QValues(empty_jaohI,newJAI)=Q;
        bg_time_step->SetUtility(empty_jaohI, newJAI, Q);
    }//end for newJAI
    if(DEBUG_QHEUR_COMP_TREE)
    {
        cout << "QFunctionJAOHTree::ComputeQ() for..."<<endl<<
            " time_step=0  called, with ISD=";
        b0.Print();
        cout <<endl;
        bg_time_step->Print();
    }
    //solve this bayesian game
    BGIP_SolverBruteForceSearch<JointPolicyPureVector> bgs(bg_time_step);
    double v = bgs.Solve();
    if(DEBUG_QHEUR_COMP_TREE)
        cout << "QFunctionJAOHTree::ComputeQ() - Expected V(b0) = " << v << endl<< endl;
    delete b0p;
    return;
}